

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QtPrivate::checkTypeIsSuitableForMetaType<QDBusMenuItemKeys>(void)

{
  return true;
}

Assistant:

static constexpr bool checkTypeIsSuitableForMetaType()
    {
        using T = typename MetatypeDecay<X>::type;
        static_assert(is_complete<T, void>::value || std::is_void_v<T>,
                "Meta Types must be fully defined");
        static_assert(!std::is_reference_v<T>,
                "Meta Types cannot be non-const references or rvalue references.");
        if constexpr (std::is_pointer_v<T> && !IsPointerDeclaredOpaque<T>::value) {
            using Pointed = std::remove_pointer_t<T>;
            static_assert(is_complete<Pointed, void>::value,
                    "Pointer Meta Types must either point to fully-defined types "
                    "or be declared with Q_DECLARE_OPAQUE_POINTER(T *)");
        }
        return true;
    }